

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

void __thiscall
argparse::ArgumentParser::parse_args_internal
          (ArgumentParser *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *aArguments)

{
  string_view aName;
  initializer_list<char> __l;
  string_view usedName;
  string_view usedName_00;
  string_view usedName_01;
  bool bVar1;
  pointer ppVar2;
  size_type sVar3;
  const_reference pvVar4;
  runtime_error *prVar5;
  long in_RDI;
  _List_iterator<argparse::Argument> tArgument_2;
  iterator tIterator2;
  string tHypotheticalArgument;
  size_t j;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tCompoundArgument;
  _List_iterator<argparse::Argument> tArgument_1;
  iterator tIterator;
  _Self tArgument;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tCurrentArgument;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  it;
  iterator positionalArgumentIt;
  const_iterator end;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe50;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffe58;
  iterator in_stack_fffffffffffffe60;
  allocator<char> *in_stack_fffffffffffffe68;
  ulong uVar6;
  _Self local_130;
  _Self local_128;
  allocator<char> local_11b;
  undefined1 local_11a;
  value_type local_119;
  undefined1 *local_118;
  undefined8 local_110;
  ulong local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  size_t local_d8;
  char *local_d0;
  Argument *in_stack_ffffffffffffff38;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_ffffffffffffff40;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_ffffffffffffff48;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_ffffffffffffff50;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_ffffffffffffff58;
  _Self local_a0;
  _Self local_98;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  Argument *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  _List_node_base *local_68;
  _Self local_50;
  __sv_type local_48;
  reference local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_28;
  _Self local_20;
  Argument *local_18;
  
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x18ea39);
  if ((bVar1) &&
     (bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(in_stack_fffffffffffffe50), !bVar1)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffe40);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38._M_current);
  }
  local_18 = (Argument *)
             std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                       ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffe38._M_current);
  local_20._M_node =
       (_List_node_base *)
       std::begin<std::__cxx11::list<argparse::Argument,std::allocator<argparse::Argument>>>
                 ((list<argparse::Argument,_std::allocator<argparse::Argument>_> *)
                  in_stack_fffffffffffffe38._M_current);
  local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                       (in_stack_fffffffffffffe38._M_current);
  local_28 = std::
             next<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                       (in_stack_fffffffffffffe38,0x18eabf);
  while( true ) {
    while( true ) {
      while( true ) {
        bVar1 = __gnu_cxx::
                operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffffe40,
                           (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffffe38._M_current);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          *(undefined1 *)(in_RDI + 0x80) = 1;
          return;
        }
        local_38 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_28);
        local_48 = std::__cxx11::string::operator_cast_to_basic_string_view
                             (in_stack_fffffffffffffe40);
        aName._M_str = (char *)in_stack_fffffffffffffe68;
        aName._M_len = (size_t)in_stack_fffffffffffffe60._M_node;
        bVar1 = Argument::is_positional(aName);
        if (!bVar1) break;
        local_50._M_node =
             (_List_node_base *)
             std::end<std::__cxx11::list<argparse::Argument,std::allocator<argparse::Argument>>>
                       ((list<argparse::Argument,_std::allocator<argparse::Argument>_> *)
                        in_stack_fffffffffffffe38._M_current);
        bVar1 = std::operator==(&local_20,&local_50);
        if (bVar1) {
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar5,"Maximum number of positional arguments exceeded");
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        local_68 = (_List_node_base *)
                   std::_List_iterator<argparse::Argument>::operator++(&local_20,0);
        std::_List_iterator<argparse::Argument>::operator->
                  ((_List_iterator<argparse::Argument> *)0x18ebed);
        local_78 = local_28._M_current;
        local_80 = local_18;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_90);
        usedName._M_str = (char *)in_stack_ffffffffffffff48._M_current;
        usedName._M_len = (size_t)in_stack_ffffffffffffff40._M_current;
        local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   Argument::
                   consume<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                             (in_stack_ffffffffffffff38,in_stack_ffffffffffffff58,
                              in_stack_ffffffffffffff50,usedName);
        local_28 = (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )local_70;
      }
      local_98._M_node =
           (_Base_ptr)
           std::
           map<std::basic_string_view<char,std::char_traits<char>>,std::_List_iterator<argparse::Argument>,std::less<void>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>>
           ::find<std::__cxx11::string>
                     ((map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>,_std::less<void>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
                       *)in_stack_fffffffffffffe38._M_current,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x18ec7f)
      ;
      local_a0._M_node =
           (_Base_ptr)
           std::
           map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>,_std::less<void>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
           ::end((map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>,_std::less<void>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
                  *)in_stack_fffffffffffffe38._M_current);
      bVar1 = std::operator==(&local_98,&local_a0);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>
                             *)0x18eccd);
      in_stack_ffffffffffffff58._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (ppVar2->second)._M_node;
      std::_List_iterator<argparse::Argument>::operator->
                ((_List_iterator<argparse::Argument> *)0x18ece6);
      in_stack_ffffffffffffff40._M_current = local_28._M_current;
      in_stack_ffffffffffffff48 =
           std::
           next<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                     (in_stack_fffffffffffffe38,0x18ed0d);
      in_stack_ffffffffffffff38 = local_18;
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>
                             *)0x18ed32);
      local_d8 = (ppVar2->first)._M_len;
      local_d0 = (ppVar2->first)._M_str;
      usedName_00._M_str = (char *)in_stack_ffffffffffffff48._M_current;
      usedName_00._M_len = (size_t)in_stack_ffffffffffffff40._M_current;
      in_stack_ffffffffffffff50 =
           Argument::
           consume<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                     (in_stack_ffffffffffffff38,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                      usedName_00);
      local_28 = in_stack_ffffffffffffff50;
    }
    local_e0 = local_38;
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (local_38);
    if (((sVar3 < 2) ||
        (pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator[](in_stack_fffffffffffffe40,
                             (size_type)in_stack_fffffffffffffe38._M_current), *pvVar4 != '-')) ||
       (pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[](in_stack_fffffffffffffe40,
                            (size_type)in_stack_fffffffffffffe38._M_current), *pvVar4 == '-'))
    break;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_28);
    local_e8 = 1;
    while (uVar6 = local_e8,
          sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  size(local_e0), uVar6 < sVar3) {
      local_11a = 0x2d;
      pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](in_stack_fffffffffffffe40,(size_type)in_stack_fffffffffffffe38._M_current)
      ;
      local_119 = *pvVar4;
      local_118 = &local_11a;
      local_110 = 2;
      in_stack_fffffffffffffe68 = &local_11b;
      std::allocator<char>::allocator();
      __l._M_len = uVar6;
      __l._M_array = (iterator)in_stack_fffffffffffffe68;
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe60._M_node,__l,
                 (allocator<char> *)in_stack_fffffffffffffe58._M_current);
      std::allocator<char>::~allocator(&local_11b);
      in_stack_fffffffffffffe60 =
           std::
           map<std::basic_string_view<char,std::char_traits<char>>,std::_List_iterator<argparse::Argument>,std::less<void>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>>
           ::find<std::__cxx11::string>
                     ((map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>,_std::less<void>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
                       *)in_stack_fffffffffffffe38._M_current,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x18eed4)
      ;
      local_128._M_node = in_stack_fffffffffffffe60._M_node;
      local_130._M_node =
           (_Base_ptr)
           std::
           map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>,_std::less<void>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
           ::end((map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>,_std::less<void>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
                  *)in_stack_fffffffffffffe38._M_current);
      bVar1 = std::operator==(&local_128,&local_130);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"Unknown argument");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>
                    *)0x18ef33);
      std::_List_iterator<argparse::Argument>::operator->
                ((_List_iterator<argparse::Argument> *)0x18ef4c);
      std::
      _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>
                    *)0x18ef78);
      usedName_01._M_str = (char *)in_stack_ffffffffffffff48._M_current;
      usedName_01._M_len = (size_t)in_stack_ffffffffffffff40._M_current;
      in_stack_fffffffffffffe58 =
           Argument::
           consume<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                     (in_stack_ffffffffffffff38,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                      usedName_01);
      local_28 = in_stack_fffffffffffffe58;
      std::__cxx11::string::~string(in_stack_fffffffffffffe40);
      local_e8 = local_e8 + 1;
    }
  }
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar5,"Unknown argument");
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void parse_args_internal(const std::vector<std::string> &aArguments) {
            if (mProgramName.empty() && !aArguments.empty()) {
                mProgramName = aArguments.front();
            }
            auto end = std::end(aArguments);
            auto positionalArgumentIt = std::begin(mPositionalArguments);
            for (auto it = std::next(std::begin(aArguments)); it != end;) {
                const auto &tCurrentArgument = *it;
                if (Argument::is_positional(tCurrentArgument)) {
                    if (positionalArgumentIt == std::end(mPositionalArguments)) {
                        throw std::runtime_error(
                                "Maximum number of positional arguments exceeded");
                    }
                    auto tArgument = positionalArgumentIt++;
                    it = tArgument->consume(it, end);
                    continue;
                }

                auto tIterator = mArgumentMap.find(tCurrentArgument);
                if (tIterator != mArgumentMap.end()) {
                    auto tArgument = tIterator->second;
                    it = tArgument->consume(std::next(it), end, tIterator->first);
                } else if (const auto &tCompoundArgument = tCurrentArgument;
                        tCompoundArgument.size() > 1 && tCompoundArgument[0] == '-' &&
                        tCompoundArgument[1] != '-') {
                    ++it;
                    for (std::size_t j = 1; j < tCompoundArgument.size(); j++) {
                        auto tHypotheticalArgument = std::string{'-', tCompoundArgument[j]};
                        auto tIterator2 = mArgumentMap.find(tHypotheticalArgument);
                        if (tIterator2 != mArgumentMap.end()) {
                            auto tArgument = tIterator2->second;
                            it = tArgument->consume(it, end, tIterator2->first);
                        } else {
                            throw std::runtime_error("Unknown argument");
                        }
                    }
                } else {
                    throw std::runtime_error("Unknown argument");
                }
            }
            mIsParsed = true;
        }